

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

size_t absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                 (size_t hash,size_t slot_size,CommonFields *common)

{
  GrowthInfo *this;
  ulong i;
  
  if (common->capacity_ == 3) {
    CommonFields::increment_size(common);
    i = (ulong)((*(uint *)&common->heap_or_soo_ >> 0xc ^ (uint)(hash >> 7) & 0x1ffffff) & 2);
    this = CommonFields::growth_info(common);
    GrowthInfo::OverwriteEmptyAsFull(this);
    SetCtrlInSingleGroupTable(common,i,(ctrl_t)hash & ~kEmpty,slot_size);
    CommonFields::infoz(common);
    return i;
  }
  __assert_fail("common.capacity() == NextCapacity(SooCapacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x85,
                "size_t absl::container_internal::PrepareInsertAfterSoo(size_t, size_t, CommonFields &)"
               );
}

Assistant:

size_t PrepareInsertAfterSoo(size_t hash, size_t slot_size,
                             CommonFields& common) {
  assert(common.capacity() == NextCapacity(SooCapacity()));
  // After resize from capacity 1 to 3, we always have exactly the slot with
  // index 1 occupied, so we need to insert either at index 0 or index 2.
  assert(HashSetResizeHelper::SooSlotIndex() == 1);
  PrepareInsertCommon(common);
  const size_t offset = H1(hash, common.control()) & 2;
  common.growth_info().OverwriteEmptyAsFull();
  SetCtrlInSingleGroupTable(common, offset, H2(hash), slot_size);
  common.infoz().RecordInsert(hash, /*distance_from_desired=*/0);
  return offset;
}